

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  Vdbe *p;
  WhereLevel *in_RDX;
  WhereTerm *in_RSI;
  int in_R9D;
  int iReg;
  Expr *pX;
  int in_stack_00000038;
  int in_stack_0000003c;
  WhereLevel *in_stack_00000040;
  WhereTerm *in_stack_00000048;
  Parse *in_stack_00000050;
  int in_stack_0000019c;
  Expr *in_stack_000001a0;
  Parse *in_stack_000001a8;
  int in_stack_ffffffffffffffc8;
  
  p = (Vdbe *)in_RSI->pExpr;
  if ((*(char *)&p->db == '6') || (*(char *)&p->db == '-')) {
    in_R9D = sqlite3ExprCodeTarget(in_stack_000001a8,in_stack_000001a0,in_stack_0000019c);
  }
  else if (*(char *)&p->db == '3') {
    sqlite3VdbeAddOp2(p,in_R9D,in_stack_ffffffffffffffc8,0);
  }
  else {
    codeINTerm(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
               in_stack_00000038,pParse._4_4_);
  }
  if (((in_RDX->pWLoop->wsFlags & 0x200000) == 0) || ((in_RSI->eOperator & 0x800) == 0)) {
    disableTerm(in_RDX,in_RSI);
  }
  return in_R9D;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(pParse->pVdbe, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    assert( pX->op==TK_IN );
    iReg = iTarget;
    codeINTerm(pParse, pTerm, pLevel, iEq, bRev, iTarget);
#endif
  }

  /* As an optimization, try to disable the WHERE clause term that is
  ** driving the index as it will always be true.  The correct answer is
  ** obtained regardless, but we might get the answer with fewer CPU cycles
  ** by omitting the term.
  **
  ** But do not disable the term unless we are certain that the term is
  ** not a transitive constraint.  For an example of where that does not
  ** work, see https://sqlite.org/forum/forumpost/eb8613976a (2021-05-04)
  */
  if( (pLevel->pWLoop->wsFlags & WHERE_TRANSCONS)==0
   || (pTerm->eOperator & WO_EQUIV)==0
  ){
    disableTerm(pLevel, pTerm);
  }

  return iReg;
}